

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3MatchinfoSelectDoctotal
              (Fts3Table *pTab,sqlite3_stmt **ppStmt,sqlite3_int64 *pnDoc,char **paLen)

{
  int iVar1;
  ulong uStack_48;
  int rc;
  sqlite3_int64 nDoc;
  char *a;
  sqlite3_stmt *pStmt;
  char **paLen_local;
  sqlite3_int64 *pnDoc_local;
  sqlite3_stmt **ppStmt_local;
  Fts3Table *pTab_local;
  
  pStmt = (sqlite3_stmt *)paLen;
  paLen_local = (char **)pnDoc;
  pnDoc_local = (sqlite3_int64 *)ppStmt;
  ppStmt_local = (sqlite3_stmt **)pTab;
  if ((*ppStmt != (sqlite3_stmt *)0x0) ||
     (pTab_local._4_4_ = sqlite3Fts3SelectDoctotal(pTab,ppStmt), pTab_local._4_4_ == 0)) {
    a = (char *)*pnDoc_local;
    nDoc = (sqlite3_int64)sqlite3_column_blob((sqlite3_stmt *)a,0);
    iVar1 = sqlite3Fts3GetVarint((char *)nDoc,(sqlite_int64 *)&stack0xffffffffffffffb8);
    if (uStack_48 == 0) {
      pTab_local._4_4_ = 0x10b;
    }
    else {
      *paLen_local = (char *)(uStack_48 & 0xffffffff);
      if (pStmt != (sqlite3_stmt *)0x0) {
        *(sqlite3_int64 *)pStmt = nDoc + iVar1;
      }
      pTab_local._4_4_ = 0;
    }
  }
  return pTab_local._4_4_;
}

Assistant:

static int fts3MatchinfoSelectDoctotal(
  Fts3Table *pTab,
  sqlite3_stmt **ppStmt,
  sqlite3_int64 *pnDoc,
  const char **paLen
){
  sqlite3_stmt *pStmt;
  const char *a;
  sqlite3_int64 nDoc;

  if( !*ppStmt ){
    int rc = sqlite3Fts3SelectDoctotal(pTab, ppStmt);
    if( rc!=SQLITE_OK ) return rc;
  }
  pStmt = *ppStmt;
  assert( sqlite3_data_count(pStmt)==1 );

  a = sqlite3_column_blob(pStmt, 0);
  a += sqlite3Fts3GetVarint(a, &nDoc);
  if( nDoc==0 ) return FTS_CORRUPT_VTAB;
  *pnDoc = (u32)nDoc;

  if( paLen ) *paLen = a;
  return SQLITE_OK;
}